

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::negI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Type *this_00;
  Literal *in_RDX;
  Literal *this_01;
  long lVar1;
  undefined1 local_c0 [8];
  LaneArray<4> lanes;
  Literal local_48;
  
  getLanes<int,4>((LaneArray<4> *)local_c0,(wasm *)this,in_RDX);
  lVar1 = 0;
  this_00 = &lanes._M_elems[3].type;
  do {
    this_01 = (Literal *)(local_c0 + lVar1);
    neg(&local_48,this_01);
    Literal((Literal *)this_00,&local_48);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_48);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  Literal(__return_storage_ptr__,(LaneArray<4> *)local_c0);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)(local_c0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::negI32x4() const {
  return unary<4, &Literal::getLanesI32x4, &Literal::neg>(*this);
}